

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O0

Spline * createSpline_38219(SplineStack *ss,float f,int bl)

{
  int iVar1;
  Spline *rsp;
  Spline *pSVar2;
  int in_ESI;
  SplineStack *in_RDI;
  float in_XMM0_Da;
  float val;
  float val_00;
  float fVar3;
  float fVar4;
  float val_01;
  float val_02;
  float der;
  double dVar5;
  float s;
  float r;
  float q;
  float p;
  float u;
  float l;
  float k;
  float i;
  Spline *sp;
  
  iVar1 = in_RDI->len;
  in_RDI->len = iVar1 + 1;
  rsp = in_RDI->stack + iVar1;
  rsp->typ = 2;
  val = getOffsetValue(-1.0,in_XMM0_Da);
  val_00 = getOffsetValue(1.0,in_XMM0_Da);
  fVar3 = ((1.0 - in_XMM0_Da) * 0.5) / ((-(1.0 - in_XMM0_Da) * 0.5 + 1.0) * 0.46082947) - 1.17;
  if ((fVar3 <= -0.65) || (1.0 <= fVar3)) {
    fVar3 = (val_00 - val) * 0.5;
    if (in_ESI == 0) {
      pSVar2 = createFixSpline(in_RDI,val);
      addSplineVal(rsp,-1.0,pSVar2,fVar3);
    }
    else {
      fVar4 = val;
      if (val <= 0.2) {
        fVar4 = 0.2;
      }
      pSVar2 = createFixSpline(in_RDI,fVar4);
      addSplineVal(rsp,-1.0,pSVar2,0.0);
      dVar5 = lerp(0.5,(double)val,(double)val_00);
      pSVar2 = createFixSpline(in_RDI,(float)dVar5);
      addSplineVal(rsp,0.0,pSVar2,fVar3);
    }
    pSVar2 = createFixSpline(in_RDI,val_00);
    addSplineVal(rsp,1.0,pSVar2,fVar3);
  }
  else {
    fVar4 = getOffsetValue(-0.65,in_XMM0_Da);
    val_01 = getOffsetValue(-0.75,in_XMM0_Da);
    val_02 = getOffsetValue(fVar3,in_XMM0_Da);
    der = (val_00 - val_02) / (1.0 - fVar3);
    pSVar2 = createFixSpline(in_RDI,val);
    addSplineVal(rsp,-1.0,pSVar2,(val_01 - val) * 4.0);
    pSVar2 = createFixSpline(in_RDI,val_01);
    addSplineVal(rsp,-0.75,pSVar2,0.0);
    pSVar2 = createFixSpline(in_RDI,fVar4);
    addSplineVal(rsp,-0.65,pSVar2,0.0);
    pSVar2 = createFixSpline(in_RDI,val_02);
    addSplineVal(rsp,fVar3 - 0.01,pSVar2,0.0);
    pSVar2 = createFixSpline(in_RDI,val_02);
    addSplineVal(rsp,fVar3,pSVar2,der);
    pSVar2 = createFixSpline(in_RDI,val_00);
    addSplineVal(rsp,1.0,pSVar2,der);
  }
  return rsp;
}

Assistant:

static Spline *createSpline_38219(SplineStack *ss, float f, int bl)
{
    Spline *sp = &ss->stack[ss->len++];
    sp->typ = SP_RIDGES;

    float i = getOffsetValue(-1.0F, f);
    float k = getOffsetValue( 1.0F, f);
    float l = 1.0F - (1.0F - f) * 0.5F;
    float u = 0.5F * (1.0F - f);
    l = u / (0.46082947F * l) - 1.17F;

    if (-0.65F < l && l < 1.0F)
    {
        float p, q, r, s;
        u = getOffsetValue(-0.65F, f);
        p = getOffsetValue(-0.75F, f);
        q = (p - i) * 4.0F;
        r = getOffsetValue(l, f);
        s = (k - r) / (1.0F - l);

        addSplineVal(sp, -1.0F,     createFixSpline(ss, i), q);
        addSplineVal(sp, -0.75F,    createFixSpline(ss, p), 0);
        addSplineVal(sp, -0.65F,    createFixSpline(ss, u), 0);
        addSplineVal(sp, l-0.01F,   createFixSpline(ss, r), 0);
        addSplineVal(sp, l,         createFixSpline(ss, r), s);
        addSplineVal(sp, 1.0F,      createFixSpline(ss, k), s);
    }
    else
    {
        u = (k - i) * 0.5F;
        if (bl) {
            addSplineVal(sp, -1.0F, createFixSpline(ss, i > 0.2 ? i : 0.2), 0);
            addSplineVal(sp,  0.0F, createFixSpline(ss, lerp(0.5F, i, k)), u);
        } else {
            addSplineVal(sp, -1.0F, createFixSpline(ss, i), u);
        }
        addSplineVal(sp, 1.0F,      createFixSpline(ss, k), u);
    }
    return sp;
}